

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_finish(nk_context *ctx,nk_window *win)

{
  void *memory;
  nk_command *parent_last;
  nk_popup_buffer *buf;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3b59,"void nk_finish(struct nk_context *, struct nk_window *)");
  }
  if (win == (nk_window *)0x0) {
    __assert_fail("win",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x3b5a,"void nk_finish(struct nk_context *, struct nk_window *)");
  }
  if (((ctx != (nk_context *)0x0) && (win != (nk_window *)0x0)) &&
     (nk_finish_buffer(ctx,&win->buffer), (win->popup).buf.active != 0)) {
    *(nk_size *)((long)(ctx->memory).memory.ptr + (win->popup).buf.parent + 8) =
         (win->popup).buf.end;
  }
  return;
}

Assistant:

NK_LIB void
nk_finish(struct nk_context *ctx, struct nk_window *win)
{
    struct nk_popup_buffer *buf;
    struct nk_command *parent_last;
    void *memory;

    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!ctx || !win) return;
    nk_finish_buffer(ctx, &win->buffer);
    if (!win->popup.buf.active) return;

    buf = &win->popup.buf;
    memory = ctx->memory.memory.ptr;
    parent_last = nk_ptr_add(struct nk_command, memory, buf->parent);
    parent_last->next = buf->end;
}